

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O2

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CClass *stm)

{
  string *psVar1;
  CIdExp *pCVar2;
  CFieldList *pCVar3;
  CMethodList *pCVar4;
  
  psVar1 = &this->code;
  std::__cxx11::string::append((char *)psVar1);
  pCVar2 = (stm->id)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  if (pCVar2 != (CIdExp *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar2->super_IExpression).super_PositionedNode)(pCVar2,this);
  }
  if ((stm->parentClass)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
      super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
      super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl != (CIdExp *)0x0) {
    std::__cxx11::string::append((char *)psVar1);
    pCVar2 = (stm->parentClass)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>.
             _M_t.super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
             super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
    (*(code *)**(undefined8 **)&(pCVar2->super_IExpression).super_PositionedNode)(pCVar2,this);
  }
  std::__cxx11::string::append((char *)psVar1);
  pCVar3 = (stm->fields)._M_t.super___uniq_ptr_impl<CFieldList,_std::default_delete<CFieldList>_>.
           _M_t.super__Tuple_impl<0UL,_CFieldList_*,_std::default_delete<CFieldList>_>.
           super__Head_base<0UL,_CFieldList_*,_false>._M_head_impl;
  if (pCVar3 != (CFieldList *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar3->super_IWrapper).super_PositionedNode)(pCVar3,this);
  }
  pCVar4 = (stm->methods)._M_t.super___uniq_ptr_impl<CMethodList,_std::default_delete<CMethodList>_>
           ._M_t.super__Tuple_impl<0UL,_CMethodList_*,_std::default_delete<CMethodList>_>.
           super__Head_base<0UL,_CMethodList_*,_false>._M_head_impl;
  if (pCVar4 != (CMethodList *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar4->super_IWrapper).super_PositionedNode)(pCVar4,this);
  }
  std::__cxx11::string::append((char *)psVar1);
  return;
}

Assistant:

void CConvertVisitor::Visit(CClass &stm) {
	this->code += "class ";
	if (stm.id) {
		stm.id->Accept(*this);
	}
	if (stm.parentClass) {
		this->code += " extends ";
		stm.parentClass->Accept(*this);
	}
	this->code += " {\n";
	if (stm.fields) {
		stm.fields->Accept(*this);
	}
	if (stm.methods) {
		stm.methods->Accept(*this);
	}
	this->code += "}\n\n";
}